

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault::SharedDtor(MessageLite *self)

{
  FeatureSet *pFVar1;
  ulong uVar2;
  
  uVar2 = (self->_internal_metadata_).ptr_;
  if ((uVar2 & 1) != 0) {
    internal::InternalMetadata::DeleteOutOfLineHelper<google::protobuf::UnknownFieldSet>
              (&self->_internal_metadata_);
    uVar2 = (self->_internal_metadata_).ptr_;
  }
  if ((uVar2 & 1) != 0) {
    uVar2 = *(ulong *)(uVar2 & 0xfffffffffffffffe);
  }
  if (uVar2 == 0) {
    pFVar1 = (FeatureSet *)self[1]._internal_metadata_.ptr_;
    if (pFVar1 != (FeatureSet *)0x0) {
      FeatureSet::~FeatureSet(pFVar1);
    }
    operator_delete(pFVar1,0x50);
    pFVar1 = (FeatureSet *)self[2]._vptr_MessageLite;
    if (pFVar1 != (FeatureSet *)0x0) {
      FeatureSet::~FeatureSet(pFVar1);
    }
    operator_delete(pFVar1,0x50);
    return;
  }
  SharedDtor((FeatureSetDefaults_FeatureSetEditionDefault *)&stack0xffffffffffffffe0);
}

Assistant:

inline void FeatureSetDefaults_FeatureSetEditionDefault::SharedDtor(MessageLite& self) {
  FeatureSetDefaults_FeatureSetEditionDefault& this_ = static_cast<FeatureSetDefaults_FeatureSetEditionDefault&>(self);
  this_._internal_metadata_.Delete<::google::protobuf::UnknownFieldSet>();
  ABSL_DCHECK(this_.GetArena() == nullptr);
  delete this_._impl_.overridable_features_;
  delete this_._impl_.fixed_features_;
  this_._impl_.~Impl_();
}